

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O0

void VL4_SSE2(uint8_t *dst,uint8_t *top)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  ulong *in_RSI;
  long in_RDI;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  undefined1 uVar11;
  undefined1 uVar12;
  undefined1 uVar13;
  undefined1 uVar14;
  undefined1 uVar15;
  undefined1 uVar16;
  undefined1 uVar17;
  undefined1 uVar18;
  undefined1 uVar19;
  undefined1 uVar20;
  undefined1 uVar21;
  undefined1 uVar22;
  undefined1 uVar23;
  undefined1 uVar24;
  undefined1 uVar25;
  undefined1 uVar26;
  undefined1 uVar27;
  undefined1 uVar28;
  undefined1 uVar29;
  undefined1 uVar30;
  undefined1 uVar31;
  undefined1 uVar32;
  undefined1 uVar33;
  undefined1 uVar34;
  undefined1 uVar35;
  undefined1 uVar36;
  undefined1 uVar37;
  undefined1 uVar38;
  undefined1 uVar39;
  undefined1 uVar40;
  undefined1 uVar41;
  undefined1 uVar42;
  undefined1 uVar43;
  undefined1 auVar6 [16];
  uint32_t extra_out;
  __m128i avg4;
  __m128i lsb2;
  __m128i abbc;
  __m128i bc;
  __m128i ab;
  __m128i lsb1;
  __m128i avg3;
  __m128i avg2;
  __m128i avg1;
  __m128i CDEFGH__;
  __m128i BCDEFGH_;
  __m128i ABCDEFGH;
  __m128i one;
  int in_stack_fffffffffffffcdc;
  undefined4 in_stack_fffffffffffffce0;
  undefined4 local_1b8;
  undefined1 local_f8;
  undefined1 uStack_f7;
  undefined1 uStack_f6;
  undefined1 uStack_f5;
  undefined1 uStack_f4;
  undefined1 uStack_f3;
  undefined1 uStack_f2;
  undefined1 uStack_f1;
  
  uVar1 = *in_RSI;
  local_f8 = (undefined1)uVar1;
  uStack_f7 = (undefined1)(uVar1 >> 8);
  uStack_f6 = (undefined1)(uVar1 >> 0x10);
  uStack_f5 = (undefined1)(uVar1 >> 0x18);
  uStack_f4 = (undefined1)(uVar1 >> 0x20);
  uStack_f3 = (undefined1)(uVar1 >> 0x28);
  uStack_f2 = (undefined1)(uVar1 >> 0x30);
  uStack_f1 = (undefined1)(uVar1 >> 0x38);
  uVar3 = pavgb(local_f8,uStack_f7);
  uVar7 = pavgb(uStack_f7,uStack_f6);
  uVar10 = pavgb(uStack_f6,uStack_f5);
  uVar13 = pavgb(uStack_f5,uStack_f4);
  uVar16 = pavgb(uStack_f4,uStack_f3);
  uVar19 = pavgb(uStack_f3,uStack_f2);
  uVar22 = pavgb(uStack_f2,uStack_f1);
  uVar25 = pavgb(uStack_f1,0);
  uVar28 = pavgb(0,0);
  uVar30 = pavgb(0,0);
  uVar32 = pavgb(0,0);
  uVar34 = pavgb(0,0);
  uVar36 = pavgb(0,0);
  uVar38 = pavgb(0,0);
  uVar40 = pavgb(0,0);
  uVar42 = pavgb(0,0);
  uVar4 = pavgb(uStack_f6,uStack_f7);
  uVar8 = pavgb(uStack_f5,uStack_f6);
  uVar11 = pavgb(uStack_f4,uStack_f5);
  uVar14 = pavgb(uStack_f3,uStack_f4);
  uVar17 = pavgb(uStack_f2,uStack_f3);
  uVar20 = pavgb(uStack_f1,uStack_f2);
  uVar23 = pavgb(0,uStack_f1);
  uVar26 = pavgb(0,0);
  uVar29 = pavgb(0,0);
  uVar31 = pavgb(0,0);
  uVar33 = pavgb(0,0);
  uVar35 = pavgb(0,0);
  uVar37 = pavgb(0,0);
  uVar39 = pavgb(0,0);
  uVar41 = pavgb(0,0);
  uVar43 = pavgb(0,0);
  uVar5 = pavgb(uVar3,uVar4);
  uVar9 = pavgb(uVar7,uVar8);
  uVar12 = pavgb(uVar10,uVar11);
  uVar15 = pavgb(uVar13,uVar14);
  uVar18 = pavgb(uVar16,uVar17);
  uVar21 = pavgb(uVar19,uVar20);
  uVar24 = pavgb(uVar22,uVar23);
  uVar27 = pavgb(uVar25,uVar26);
  uVar28 = pavgb(uVar28,uVar29);
  uVar29 = pavgb(uVar30,uVar31);
  uVar30 = pavgb(uVar32,uVar33);
  uVar31 = pavgb(uVar34,uVar35);
  uVar32 = pavgb(uVar36,uVar37);
  uVar33 = pavgb(uVar38,uVar39);
  uVar34 = pavgb(uVar40,uVar41);
  uVar35 = pavgb(uVar42,uVar43);
  auVar2[1] = uVar9;
  auVar2[0] = uVar5;
  auVar2[2] = uVar12;
  auVar2[3] = uVar15;
  auVar2[4] = uVar18;
  auVar2[5] = uVar21;
  auVar2[6] = uVar24;
  auVar2[7] = uVar27;
  auVar2[9] = uVar29;
  auVar2[8] = uVar28;
  auVar2[10] = uVar30;
  auVar2[0xb] = uVar31;
  auVar2[0xc] = uVar32;
  auVar2[0xd] = uVar33;
  auVar2[0xe] = uVar34;
  auVar2[0xf] = uVar35;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (uVar1 ^ uVar1 >> 8 | uVar1 >> 0x10 ^ uVar1 >> 8) &
                 (CONCAT17(uVar25,CONCAT16(uVar22,CONCAT15(uVar19,CONCAT14(uVar16,CONCAT13(uVar13,
                                                  CONCAT12(uVar10,CONCAT11(uVar7,uVar3))))))) ^
                 CONCAT17(uVar26,CONCAT16(uVar23,CONCAT15(uVar20,CONCAT14(uVar17,CONCAT13(uVar14,
                                                  CONCAT12(uVar11,CONCAT11(uVar8,uVar4)))))))) &
                 0x101010101010101;
  auVar6 = psubusb(auVar2,auVar6);
  local_1b8 = auVar6._4_4_;
  WebPInt32ToMem((uint8_t *)CONCAT44(local_1b8,in_stack_fffffffffffffce0),in_stack_fffffffffffffcdc)
  ;
  WebPInt32ToMem((uint8_t *)CONCAT44(local_1b8,in_stack_fffffffffffffce0),in_stack_fffffffffffffcdc)
  ;
  WebPInt32ToMem((uint8_t *)CONCAT44(local_1b8,in_stack_fffffffffffffce0),in_stack_fffffffffffffcdc)
  ;
  WebPInt32ToMem((uint8_t *)CONCAT44(local_1b8,in_stack_fffffffffffffce0),in_stack_fffffffffffffcdc)
  ;
  *(char *)(in_RDI + 0x43) = (char)local_1b8;
  *(char *)(in_RDI + 99) = (char)((uint)local_1b8 >> 8);
  return;
}

Assistant:

static void VL4_SSE2(uint8_t* dst) {   // Vertical-Left
  const __m128i one = _mm_set1_epi8(1);
  const __m128i ABCDEFGH = _mm_loadl_epi64((__m128i*)(dst - BPS));
  const __m128i BCDEFGH_ = _mm_srli_si128(ABCDEFGH, 1);
  const __m128i CDEFGH__ = _mm_srli_si128(ABCDEFGH, 2);
  const __m128i avg1 = _mm_avg_epu8(ABCDEFGH, BCDEFGH_);
  const __m128i avg2 = _mm_avg_epu8(CDEFGH__, BCDEFGH_);
  const __m128i avg3 = _mm_avg_epu8(avg1, avg2);
  const __m128i lsb1 = _mm_and_si128(_mm_xor_si128(avg1, avg2), one);
  const __m128i ab = _mm_xor_si128(ABCDEFGH, BCDEFGH_);
  const __m128i bc = _mm_xor_si128(CDEFGH__, BCDEFGH_);
  const __m128i abbc = _mm_or_si128(ab, bc);
  const __m128i lsb2 = _mm_and_si128(abbc, lsb1);
  const __m128i avg4 = _mm_subs_epu8(avg3, lsb2);
  const uint32_t extra_out =
      (uint32_t)_mm_cvtsi128_si32(_mm_srli_si128(avg4, 4));
  WebPInt32ToMem(dst + 0 * BPS, _mm_cvtsi128_si32(               avg1    ));
  WebPInt32ToMem(dst + 1 * BPS, _mm_cvtsi128_si32(               avg4    ));
  WebPInt32ToMem(dst + 2 * BPS, _mm_cvtsi128_si32(_mm_srli_si128(avg1, 1)));
  WebPInt32ToMem(dst + 3 * BPS, _mm_cvtsi128_si32(_mm_srli_si128(avg4, 1)));

  // these two are hard to get and irregular
  DST(3, 2) = (extra_out >> 0) & 0xff;
  DST(3, 3) = (extra_out >> 8) & 0xff;
}